

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

void mxx::scatterv<int>(int *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
                       int *out,size_t recv_size,int root,comm *comm)

{
  pointer puVar1;
  vector<int,_std::allocator<int>_> send_counts;
  datatype dt;
  vector<int,_std::allocator<int>_> displs;
  size_t send_size;
  
  puVar1 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((comm->m_rank == root) &&
     ((long)(sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 >> 3 != (long)comm->m_size)) {
    assert_fail("root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size())",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                ,0x142,"scatterv");
    puVar1 = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  send_size = 0;
  for (; puVar1 != (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    send_size = send_size + *puVar1;
  }
  bcast<unsigned_long>(&send_size,root,comm);
  if (send_size < 0x7fffffff) {
    dt._vptr_datatype = (_func_int **)&PTR__datatype_00142200;
    dt.mpitype = (MPI_Datatype)&ompi_mpi_int;
    dt.builtin = true;
    if (comm->m_rank == root) {
      std::vector<int,_std::allocator<int>_>::vector
                (&send_counts,(long)comm->m_size,(allocator_type *)&displs);
      std::
      __copy_move_a<false,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      impl::get_displacements<int>(&displs,&send_counts);
      MPI_Scatterv(msgs,send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                   displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,dt.mpitype,out,recv_size,dt.mpitype,root,
                   comm->mpi_comm);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&displs.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&send_counts.super__Vector_base<int,_std::allocator<int>_>);
    }
    else {
      MPI_Scatterv(0,0,0,&ompi_mpi_datatype_null,out,recv_size,&ompi_mpi_int,root,comm->mpi_comm);
    }
    datatype::~datatype(&dt);
  }
  else {
    impl::scatterv_big<int>(msgs,sizes,out,recv_size,root,comm);
  }
  return;
}

Assistant:

void scatterv(const T* msgs, const std::vector<size_t>& sizes, T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size()));
    // get total send size
    size_t send_size = std::accumulate(sizes.begin(), sizes.end(), static_cast<size_t>(0));
    mxx::bcast(send_size, root, comm);
    // check if we need to use the custom BIG scatterv
    if (send_size >= mxx::max_int) {
        // own scatter for large messages
        impl::scatterv_big(msgs, sizes, out, recv_size, root, comm);
    } else {
        // regular implementation using integer counts
        mxx::datatype dt = mxx::get_datatype<T>();
        int irecv_size = recv_size;
        if (comm.rank() == root) {
            std::vector<int> send_counts(comm.size());
            std::copy(sizes.begin(), sizes.end(), send_counts.begin());
            std::vector<int> displs = impl::get_displacements(send_counts);
            MPI_Scatterv(const_cast<T*>(msgs), &send_counts[0], &displs[0], dt.type(),
                         out, irecv_size, dt.type(), root, comm);
        } else {
            MPI_Scatterv(NULL, NULL, NULL, MPI_DATATYPE_NULL,
                         out, irecv_size, dt.type(), root, comm);
        }
    }
}